

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O3

void __thiscall OpenMD::BondOrderParameter::process(BondOrderParameter *this)

{
  key_type *pkVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  char cVar5;
  SimInfo *info;
  Atom *pAVar6;
  pointer pdVar7;
  undefined1 auVar8 [16];
  pointer pcVar9;
  Molecule *pMVar10;
  uint i_1;
  StuntDouble *pSVar11;
  mapped_type *pmVar12;
  Molecule *pMVar13;
  long lVar14;
  mapped_type *pmVar15;
  uint *puVar16;
  mapped_type *pmVar17;
  BondOrderParameter *pBVar18;
  int mmm;
  int iVar19;
  int iVar20;
  uint uVar21;
  pointer ppAVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *pmVar27;
  int mmm_1;
  uint uVar28;
  key_type kVar29;
  double tmp;
  double dVar30;
  undefined8 extraout_XMM0_Qa;
  pointer extraout_XMM0_Qb;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 uVar34;
  int i;
  pair<int,_int> lm;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> W;
  vector<double,_std::allocator<double>_> Q2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> w;
  vector<double,_std::allocator<double>_> q2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> W_hat;
  vector<double,_std::allocator<double>_> Q;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> w_hat;
  vector<double,_std::allocator<double>_> q_l;
  Vector3d vec;
  MoleculeIterator mi;
  SphericalHarmonic sphericalHarmonic;
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  QBar;
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  q;
  DumpReader reader;
  SelectionSet local_1578;
  uint local_155c;
  int local_1558;
  int iStack_1554;
  pointer pOStack_1550;
  StuntDouble *local_1548;
  BondOrderParameter *local_1540;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_1538;
  Molecule *local_1530;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_1528;
  int local_1520;
  int local_151c;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_1518;
  map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_1510;
  key_type local_1508;
  int local_1500;
  int local_14fc;
  pointer local_14f8;
  pointer ppAStack_14f0;
  key_type local_14e8 [4];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_14c8;
  vector<double,_std::allocator<double>_> local_14a8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_1488;
  vector<double,_std::allocator<double>_> local_1468;
  double local_1448;
  undefined8 uStack_1440;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_1438;
  vector<double,_std::allocator<double>_> local_1418;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_13f8;
  vector<double,_std::allocator<double>_> local_13d8;
  Vector3d local_13b8;
  SelectionManager *local_1398;
  MoleculeIterator local_1390;
  key_type local_1388 [4];
  SelectionEvaluator *local_1368;
  ulong local_1360;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_1358;
  vector<double,_std::allocator<double>_> local_1340;
  vector<double,_std::allocator<double>_> local_1328;
  SphericalHarmonic local_1310;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_1300;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::complex<double>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  local_12e8;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::complex<double>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  local_12b8;
  DumpReader local_1288;
  
  local_1390._M_node = (_Base_ptr)0x0;
  local_13b8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_12b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_12b8._M_impl.super__Rb_tree_header._M_header;
  local_12b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_12b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_12b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1488.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1488.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1488.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13f8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_13f8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13f8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_12e8._M_impl.super__Rb_tree_header._M_header;
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_12e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_14c8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_14c8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_14c8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1438.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1438.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1438.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_12e8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_12b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_12b8._M_impl.super__Rb_tree_header._M_header._M_left;
  SphericalHarmonic::SphericalHarmonic(&local_1310);
  info = (this->super_StaticAnalyser).info_;
  cVar5 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_1520 = DumpReader::getNFrames(&local_1288);
  this->frameCounter_ = 0;
  std::vector<double,_std::allocator<double>_>::resize(&local_13d8,0xd);
  std::vector<double,_std::allocator<double>_>::resize(&local_1468,0xd);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&local_1488,0xd)
  ;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&local_13f8,0xd)
  ;
  std::vector<double,_std::allocator<double>_>::resize(&local_14a8,0xd);
  std::vector<double,_std::allocator<double>_>::resize(&local_1418,0xd);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&local_14c8,0xd)
  ;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&local_1438,0xd)
  ;
  local_1540 = this;
  if (local_1520 < 1) {
    pOStack_1550 = (pointer)0x0;
  }
  else {
    local_1368 = &this->evaluator_;
    local_1398 = &this->seleMan_;
    local_1518 = &this->m2Max;
    local_1528 = &this->m2Min;
    local_1510 = &this->w3j;
    uVar26 = 0;
    local_151c = 0;
    do {
      DumpReader::readFrame(&local_1288,(int)uVar26);
      this->frameCounter_ = this->frameCounter_ + 1;
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1578,local_1368);
        lVar25 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar25),(vector<bool,_std::allocator<bool>_> *)
                             ((long)local_1578.bitsets_.
                                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar25));
          lVar25 = lVar25 + 0x28;
        } while (lVar25 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1578.bitsets_);
      }
      pSVar11 = SelectionManager::beginSelected(local_1398,&local_14fc);
      local_1360 = uVar26;
      while (pSVar11 != (StuntDouble *)0x0) {
        uVar21 = pSVar11->globalIndex_;
        iVar19 = 1;
        uVar26 = 0;
        local_1548 = pSVar11;
        do {
          uVar28 = -(int)uVar26;
          iVar20 = iVar19;
          do {
            local_1578.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)((ulong)uVar28 << 0x20 | uVar26);
            pmVar12 = std::
                      map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                      ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                    *)&local_12b8,(key_type *)&local_1578);
            pBVar18 = local_1540;
            *(undefined8 *)pmVar12->_M_value = 0;
            *(undefined8 *)(pmVar12->_M_value + 8) = 0;
            uVar28 = uVar28 + 1;
            iVar20 = iVar20 + -1;
          } while (iVar20 != 0);
          uVar26 = uVar26 + 1;
          iVar19 = iVar19 + 2;
        } while (uVar26 != 0xd);
        pMVar13 = SimInfo::beginMolecule((local_1540->super_StaticAnalyser).info_,&local_1390);
        iVar19 = 0;
        pSVar11 = local_1548;
        local_155c = uVar21;
        while (pMVar13 != (Molecule *)0x0) {
          ppAVar22 = (pMVar13->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pMVar10 = local_1530;
          if (ppAVar22 !=
              (pMVar13->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pAVar6 = *ppAVar22;
            local_1530 = pMVar13;
            while (pAVar6 != (Atom *)0x0) {
              if ((pAVar6->super_StuntDouble).globalIndex_ != uVar21) {
                lVar25 = *(long *)((long)&(pSVar11->snapshotMan_->currentSnapshot_->atomData).
                                          position.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar11->storage_);
                local_14e8[2] =
                     (key_type)*(undefined8 *)(lVar25 + 0x10 + (long)pSVar11->localIndex_ * 0x18);
                pkVar1 = (key_type *)(lVar25 + (long)pSVar11->localIndex_ * 0x18);
                local_14e8[0] = *pkVar1;
                local_14e8[1] = pkVar1[1];
                lVar14 = (long)(pAVar6->super_StuntDouble).localIndex_;
                lVar25 = *(long *)((long)&(((pAVar6->super_StuntDouble).snapshotMan_)->
                                           currentSnapshot_->atomData).position.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (pAVar6->super_StuntDouble).storage_);
                local_1388[2] = (key_type)*(undefined8 *)(lVar25 + 0x10 + lVar14 * 0x18);
                pkVar1 = (key_type *)(lVar25 + lVar14 * 0x18);
                local_1388[0] = *pkVar1;
                local_1388[1] = pkVar1[1];
                local_1578.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_1578.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1578.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                lVar25 = 0;
                do {
                  (&local_1578.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_start)[lVar25] =
                       (pointer)((double)local_14e8[lVar25] - (double)local_1388[lVar25]);
                  lVar25 = lVar25 + 1;
                } while (lVar25 != 3);
                local_13b8.super_Vector<double,_3U>.data_[2] =
                     (double)local_1578.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_13b8.super_Vector<double,_3U>.data_[0] =
                     (double)local_1578.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                local_13b8.super_Vector<double,_3U>.data_[1] =
                     (double)local_1578.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                if (cVar5 != '\0') {
                  Snapshot::wrapVector(pBVar18->currentSnapshot_,&local_13b8);
                }
                dVar30 = 0.0;
                lVar25 = 0;
                do {
                  dVar4 = local_13b8.super_Vector<double,_3U>.data_[lVar25];
                  dVar30 = dVar30 + dVar4 * dVar4;
                  lVar25 = lVar25 + 1;
                } while (lVar25 != 3);
                if (dVar30 < 0.0) {
                  dVar30 = sqrt(dVar30);
                }
                else {
                  dVar30 = SQRT(dVar30);
                }
                if (dVar30 < pBVar18->rCut_) {
                  dVar30 = local_13b8.super_Vector<double,_3U>.data_[2] / dVar30;
                  local_14f8 = ppAVar22;
                  local_1538 = (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                                *)atan2(local_13b8.super_Vector<double,_3U>.data_[1],
                                        local_13b8.super_Vector<double,_3U>.data_[0]);
                  iVar20 = 1;
                  uVar26 = 0;
                  do {
                    local_1310.L = (int)uVar26;
                    uVar21 = -local_1310.L;
                    iVar23 = iVar20;
                    do {
                      uVar34 = 0;
                      pmVar27 = local_1538;
                      local_1310.M = uVar21;
                      SphericalHarmonic::getValueAt(&local_1310,dVar30,(RealType)local_1538);
                      local_1558 = (int)extraout_XMM0_Qa;
                      iStack_1554 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
                      local_1578.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)((ulong)uVar21 << 0x20 | uVar26);
                      pOStack_1550 = extraout_XMM0_Qb;
                      local_1448 = (double)pmVar27;
                      uStack_1440 = uVar34;
                      pmVar12 = std::
                                map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                              *)&local_12b8,(key_type *)&local_1578);
                      dVar4 = *(double *)(pmVar12->_M_value + 8);
                      *(double *)pmVar12->_M_value =
                           (double)CONCAT44(iStack_1554,local_1558) + *(double *)pmVar12->_M_value;
                      *(double *)(pmVar12->_M_value + 8) = local_1448 + dVar4;
                      uVar21 = uVar21 + 1;
                      iVar23 = iVar23 + -1;
                    } while (iVar23 != 0);
                    uVar26 = uVar26 + 1;
                    iVar20 = iVar20 + 2;
                  } while (uVar26 != 0xd);
                  iVar19 = iVar19 + 1;
                  pBVar18 = local_1540;
                  ppAVar22 = local_14f8;
                  pSVar11 = local_1548;
                  pMVar13 = local_1530;
                  uVar21 = local_155c;
                }
              }
              ppAVar22 = ppAVar22 + 1;
              pMVar10 = local_1530;
              if (ppAVar22 ==
                  (pMVar13->atoms_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) break;
              pAVar6 = *ppAVar22;
            }
          }
          local_1530 = pMVar10;
          pMVar13 = SimInfo::nextMolecule((pBVar18->super_StaticAnalyser).info_,&local_1390);
        }
        local_14f8 = (pointer)(double)iVar19;
        iVar20 = 1;
        uVar26 = 0;
        local_1500 = iVar19;
        ppAStack_14f0 = local_14f8;
        do {
          local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = 0.0;
          uVar21 = -(int)uVar26;
          local_1558 = iVar20;
          do {
            kVar29 = (key_type)((ulong)uVar21 << 0x20 | uVar26);
            local_1578.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)kVar29;
            pmVar12 = std::
                      map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                      ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                    *)&local_12b8,(key_type *)&local_1578);
            auVar31._8_8_ = ppAStack_14f0;
            auVar31._0_8_ = local_14f8;
            auVar31 = divpd(*(undefined1 (*) [16])pmVar12->_M_value,auVar31);
            *(undefined1 (*) [16])pmVar12->_M_value = auVar31;
            local_1578.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)kVar29;
            pmVar12 = std::
                      map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                      ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                    *)&local_12b8,(key_type *)&local_1578);
            local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar26] =
                 *(double *)pmVar12->_M_value * *(double *)pmVar12->_M_value +
                 *(double *)(pmVar12->_M_value + 8) * *(double *)(pmVar12->_M_value + 8) +
                 local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar26];
            uVar21 = uVar21 + 1;
            iVar20 = iVar20 + -1;
          } while (iVar20 != 0);
          dVar30 = (local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar26] * 4.0 * 3.141592653589793) /
                   (double)((int)uVar26 * 2 + 1);
          if (dVar30 < 0.0) {
            dVar30 = sqrt(dVar30);
          }
          else {
            dVar30 = SQRT(dVar30);
          }
          local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = dVar30;
          uVar26 = uVar26 + 1;
          iVar20 = local_1558 + 2;
        } while (uVar26 != 0xd);
        local_155c = 1;
        uVar26 = 0;
        pmVar27 = local_1528;
        do {
          local_1538 = (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                        *)(uVar26 * 0x10);
          uVar21 = -(int)uVar26;
          *(undefined8 *)
           local_1488.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar26]._M_value = 0;
          *(undefined8 *)
           ((long)local_1488.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar26]._M_value + 8) = 0;
          uVar24 = uVar26 & 0xffffffff;
          do {
            local_1530 = (Molecule *)(ulong)uVar21;
            local_14e8[0] = (key_type)((long)local_1530 << 0x20 | uVar26);
            local_1548 = (StuntDouble *)CONCAT44(local_1548._4_4_,(int)uVar24);
            lVar25 = 0;
            while( true ) {
              pmVar15 = std::
                        map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                        ::operator[](local_1518,local_14e8);
              iVar19 = *pmVar15;
              pmVar15 = std::
                        map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                        ::operator[](pmVar27,local_14e8);
              pcVar9 = local_1488.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((long)iVar19 - (long)*pmVar15 < lVar25) break;
              puVar16 = (uint *)std::
                                map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                                ::operator[](pmVar27,local_14e8);
              uVar21 = *puVar16;
              pmVar17 = std::
                        map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ::operator[](local_1510,local_14e8);
              pdVar7 = (pmVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pmVar12 = std::
                        map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                        ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                      *)&local_12b8,local_14e8);
              pOStack_1550 = *(pointer *)(pmVar12->_M_value + 8);
              local_1558 = (int)*(undefined8 *)pmVar12->_M_value;
              iStack_1554 = (int)((ulong)*(undefined8 *)pmVar12->_M_value >> 0x20);
              local_1448 = pdVar7[lVar25];
              uStack_1440 = 0;
              local_1388[0] = (key_type)((ulong)uVar21 + lVar25 << 0x20 | uVar26);
              pmVar12 = std::
                        map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                        ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                      *)&local_12b8,local_1388);
              local_1578.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)((double)CONCAT44(iStack_1554,local_1558) * local_1448);
              local_1578.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((double)pOStack_1550 * local_1448);
              std::complex<double>::operator*=((complex<double> *)&local_1578,pmVar12);
              local_1558 = (int)local_1578.bitsets_.
                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                ._M_impl.super__Vector_impl_data._M_start;
              iStack_1554 = (int)((ulong)local_1578.bitsets_.
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 0x20);
              pOStack_1550 = local_1578.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
              local_1508 = (key_type)((ulong)((int)uVar24 - uVar21) << 0x20 | uVar26);
              pmVar12 = std::
                        map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                        ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                      *)&local_12b8,&local_1508);
              local_1578.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start._4_4_ = iStack_1554;
              local_1578.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = local_1558;
              local_1578.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = pOStack_1550;
              std::complex<double>::operator*=((complex<double> *)&local_1578,pmVar12);
              pdVar2 = (double *)
                       ((long)(local_1488.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_value +
                       (long)local_1538);
              dVar30 = pdVar2[1];
              pdVar3 = (double *)
                       ((long)(local_1488.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_value +
                       (long)local_1538);
              *pdVar3 = *pdVar2 + (double)local_1578.bitsets_.
                                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
              pdVar3[1] = dVar30 + (double)local_1578.bitsets_.
                                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
              lVar25 = lVar25 + 1;
              uVar24 = (ulong)((int)uVar24 - 1);
              pmVar27 = local_1528;
            }
            uVar21 = (int)local_1530 + 1;
            uVar24 = (ulong)((uint)local_1548 - 1);
          } while (uVar21 != local_155c);
          auVar32._0_8_ =
               pow(local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar26],1.5);
          auVar32._8_8_ = auVar32._0_8_;
          auVar31 = divpd(*(undefined1 (*) [16])((long)pcVar9->_M_value + (long)local_1538),auVar32)
          ;
          *(undefined1 (*) [16])
           ((long)(local_13f8.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1538) = auVar31
          ;
          uVar26 = uVar26 + 1;
          local_155c = local_155c + 1;
        } while (uVar26 != 0xd);
        std::vector<double,_std::allocator<double>_>::vector(&local_1328,&local_13d8);
        pBVar18 = local_1540;
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                  (&local_1300,&local_13f8);
        iVar19 = local_1500;
        (*(pBVar18->super_StaticAnalyser)._vptr_StaticAnalyser[5])(pBVar18,&local_1328,&local_1300);
        if (local_1300.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1300.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1300.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1300.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1328.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1328.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_151c = local_151c + iVar19;
        iVar19 = 1;
        uVar26 = 0;
        do {
          uVar21 = -(int)uVar26;
          iVar20 = iVar19;
          do {
            kVar29 = (key_type)((ulong)uVar21 << 0x20 | uVar26);
            local_1578.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)kVar29;
            pmVar12 = std::
                      map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                      ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                    *)&local_12b8,(key_type *)&local_1578);
            pOStack_1550 = *(pointer *)(pmVar12->_M_value + 8);
            local_1558 = (int)*(undefined8 *)pmVar12->_M_value;
            iStack_1554 = (int)((ulong)*(undefined8 *)pmVar12->_M_value >> 0x20);
            local_14e8[0] = kVar29;
            pmVar12 = std::
                      map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                      ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                    *)&local_12e8,local_14e8);
            dVar30 = *(double *)(pmVar12->_M_value + 8);
            *(double *)pmVar12->_M_value =
                 *(double *)pmVar12->_M_value +
                 (double)CONCAT44(iStack_1554,local_1558) * (double)local_14f8;
            *(double *)(pmVar12->_M_value + 8) =
                 dVar30 + (double)pOStack_1550 * (double)ppAStack_14f0;
            uVar21 = uVar21 + 1;
            iVar20 = iVar20 + -1;
          } while (iVar20 != 0);
          uVar26 = uVar26 + 1;
          iVar19 = iVar19 + 2;
        } while (uVar26 != 0xd);
        pSVar11 = SelectionManager::nextSelected(local_1398,&local_14fc);
        this = local_1540;
      }
      uVar21 = (int)local_1360 + (this->super_StaticAnalyser).step_;
      uVar26 = (ulong)uVar21;
    } while ((int)uVar21 < local_1520);
    pOStack_1550 = (pointer)(double)local_151c;
  }
  iVar19 = 1;
  uVar26 = 0;
  local_1558 = (int)pOStack_1550;
  iStack_1554 = (int)((ulong)pOStack_1550 >> 0x20);
  do {
    uVar21 = -(int)uVar26;
    iVar20 = iVar19;
    do {
      local_1578.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)uVar21 << 0x20 | uVar26);
      pmVar12 = std::
                map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                              *)&local_12e8,(key_type *)&local_1578);
      auVar8._4_4_ = iStack_1554;
      auVar8._0_4_ = local_1558;
      auVar8._8_8_ = pOStack_1550;
      auVar31 = divpd(*(undefined1 (*) [16])pmVar12->_M_value,auVar8);
      *(undefined1 (*) [16])pmVar12->_M_value = auVar31;
      uVar21 = uVar21 + 1;
      iVar20 = iVar20 + -1;
    } while (iVar20 != 0);
    uVar26 = uVar26 + 1;
    iVar19 = iVar19 + 2;
  } while (uVar26 != 0xd);
  iVar19 = 1;
  uVar26 = 0;
  do {
    local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar26] = 0.0;
    uVar21 = -(int)uVar26;
    iVar20 = iVar19;
    do {
      local_1578.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)uVar21 << 0x20 | uVar26);
      pmVar12 = std::
                map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                              *)&local_12e8,(key_type *)&local_1578);
      local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar26] =
           *(double *)pmVar12->_M_value * *(double *)pmVar12->_M_value +
           *(double *)(pmVar12->_M_value + 8) * *(double *)(pmVar12->_M_value + 8) +
           local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar26];
      uVar21 = uVar21 + 1;
      iVar20 = iVar20 + -1;
    } while (iVar20 != 0);
    dVar30 = (local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar26] * 4.0 * 3.141592653589793) /
             (double)((int)uVar26 * 2 + 1);
    if (dVar30 < 0.0) {
      dVar30 = sqrt(dVar30);
    }
    else {
      dVar30 = SQRT(dVar30);
    }
    local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar26] = dVar30;
    uVar26 = uVar26 + 1;
    iVar19 = iVar19 + 2;
  } while (uVar26 != 0xd);
  local_1538 = &local_1540->m2Max;
  pmVar27 = &local_1540->m2Min;
  local_1528 = (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                *)&local_1540->w3j;
  local_1548 = (StuntDouble *)CONCAT44(local_1548._4_4_,1);
  uVar26 = 0;
  local_1510 = (map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                *)pmVar27;
  do {
    local_1518 = (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  *)(uVar26 * 0x10);
    uVar21 = -(int)uVar26;
    *(undefined8 *)
     local_14c8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
     _M_impl.super__Vector_impl_data._M_start[uVar26]._M_value = 0;
    *(undefined8 *)
     ((long)local_14c8.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start[uVar26]._M_value + 8) = 0;
    uVar24 = uVar26 & 0xffffffff;
    do {
      local_14f8 = (pointer)(ulong)uVar21;
      local_14e8[0] = (key_type)((long)local_14f8 << 0x20 | uVar26);
      local_1530 = (Molecule *)CONCAT44(local_1530._4_4_,(int)uVar24);
      lVar25 = 0;
      while( true ) {
        pmVar15 = std::
                  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  ::operator[](local_1538,local_14e8);
        iVar19 = *pmVar15;
        pmVar15 = std::
                  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  ::operator[](pmVar27,local_14e8);
        pcVar9 = local_14c8.
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((long)iVar19 - (long)*pmVar15 < lVar25) break;
        puVar16 = (uint *)std::
                          map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                          ::operator[](pmVar27,local_14e8);
        uVar21 = *puVar16;
        pmVar17 = std::
                  map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                                *)local_1528,local_14e8);
        pdVar7 = (pmVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pmVar12 = std::
                  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                *)&local_12e8,local_14e8);
        pOStack_1550 = *(pointer *)(pmVar12->_M_value + 8);
        local_1558 = (int)*(undefined8 *)pmVar12->_M_value;
        iStack_1554 = (int)((ulong)*(undefined8 *)pmVar12->_M_value >> 0x20);
        local_1448 = pdVar7[lVar25];
        uStack_1440 = 0;
        local_1388[0] = (key_type)(lVar25 + (ulong)uVar21 << 0x20 | uVar26);
        pmVar12 = std::
                  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                *)&local_12e8,local_1388);
        local_1578.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((double)CONCAT44(iStack_1554,local_1558) * local_1448);
        local_1578.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)((double)pOStack_1550 * local_1448);
        std::complex<double>::operator*=((complex<double> *)&local_1578,pmVar12);
        local_1558 = (int)local_1578.bitsets_.
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        iStack_1554 = (int)((ulong)local_1578.bitsets_.
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 0x20);
        pOStack_1550 = local_1578.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
        local_1508 = (key_type)((ulong)((int)uVar24 - uVar21) << 0x20 | uVar26);
        pmVar12 = std::
                  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                *)&local_12e8,&local_1508);
        local_1578.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = iStack_1554;
        local_1578.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = local_1558;
        local_1578.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = pOStack_1550;
        std::complex<double>::operator*=((complex<double> *)&local_1578,pmVar12);
        pdVar2 = (double *)
                 ((long)(local_14c8.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1518);
        dVar30 = pdVar2[1];
        pdVar3 = (double *)
                 ((long)(local_14c8.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1518);
        *pdVar3 = *pdVar2 + (double)local_1578.bitsets_.
                                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
        pdVar3[1] = dVar30 + (double)local_1578.bitsets_.
                                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
        lVar25 = lVar25 + 1;
        uVar24 = (ulong)((int)uVar24 - 1);
        pmVar27 = (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                   *)local_1510;
      }
      uVar21 = (int)local_14f8 + 1;
      uVar24 = (ulong)((int)local_1530 - 1);
    } while (uVar21 != (uint)local_1548);
    auVar33._0_8_ =
         pow(local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar26],1.5);
    auVar33._8_8_ = auVar33._0_8_;
    auVar31 = divpd(*(undefined1 (*) [16])((long)pcVar9->_M_value + (long)local_1518),auVar33);
    *(undefined1 (*) [16])
     ((long)(local_1438.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1518) = auVar31;
    uVar26 = uVar26 + 1;
    local_1548 = (StuntDouble *)CONCAT44(local_1548._4_4_,(uint)local_1548 + 1);
  } while (uVar26 != 0xd);
  std::vector<double,_std::allocator<double>_>::vector(&local_1340,&local_1418);
  pBVar18 = local_1540;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_1358,&local_1438);
  writeOrderParameter(pBVar18,&local_1340,&local_1358);
  if (local_1358.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1358.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1358.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1358.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1340.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1340.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1340.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1340.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  DumpReader::~DumpReader(&local_1288);
  if (local_1438.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1438.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1438.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1438.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_14c8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_14c8.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_14c8.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_14c8.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_14a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::complex<double>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  ::~_Rb_tree(&local_12e8);
  if (local_13f8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_13f8.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_13f8.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_13f8.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1488.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1488.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1488.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1488.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::complex<double>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  ::~_Rb_tree(&local_12b8);
  return;
}

Assistant:

void BondOrderParameter::process() {
    Molecule* mol;
    Atom* atom;
    int myIndex;
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    StuntDouble* sd;
    Vector3d vec;
    RealType costheta;
    RealType phi;
    RealType r;
    std::map<std::pair<int, int>, ComplexType> q;
    std::vector<RealType> q_l;
    std::vector<RealType> q2;
    std::vector<ComplexType> w;
    std::vector<ComplexType> w_hat;
    std::map<std::pair<int, int>, ComplexType> QBar;
    std::vector<RealType> Q2;
    std::vector<RealType> Q;
    std::vector<ComplexType> W;
    std::vector<ComplexType> W_hat;
    int nBonds, Nbonds;
    SphericalHarmonic sphericalHarmonic;
    int i;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    q_l.resize(lMax_ + 1);
    q2.resize(lMax_ + 1);
    w.resize(lMax_ + 1);
    w_hat.resize(lMax_ + 1);

    Q2.resize(lMax_ + 1);
    Q.resize(lMax_ + 1);
    W.resize(lMax_ + 1);
    W_hat.resize(lMax_ + 1);
    Nbonds = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      frameCounter_++;
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:

      for (sd = seleMan_.beginSelected(i); sd != NULL;
           sd = seleMan_.nextSelected(i)) {
        myIndex = sd->getGlobalIndex();
        nBonds  = 0;

        for (int l = 0; l <= lMax_; l++) {
          for (int m = -l; m <= l; m++) {
            q[std::make_pair(l, m)] = 0.0;
          }
        }

        // inner loop is over all other atoms in the system:

        for (mol = info_->beginMolecule(mi); mol != NULL;
             mol = info_->nextMolecule(mi)) {
          for (atom = mol->beginAtom(ai); atom != NULL;
               atom = mol->nextAtom(ai)) {
            if (atom->getGlobalIndex() != myIndex) {
              vec = sd->getPos() - atom->getPos();

              if (usePeriodicBoundaryConditions_)
                currentSnapshot_->wrapVector(vec);

              // Calculate "bonds" and build Q_lm(r) where
              //      Q_lm = Y_lm(theta(r),phi(r))
              // The spherical harmonics are wrt any arbitrary coordinate
              // system, we choose standard spherical coordinates

              r = vec.length();

              // Check to see if neighbor is in bond cutoff

              if (r < rCut_) {
                costheta = vec.z() / r;
                phi      = atan2(vec.y(), vec.x());

                for (int l = 0; l <= lMax_; l++) {
                  sphericalHarmonic.setL(l);
                  for (int m = -l; m <= l; m++) {
                    sphericalHarmonic.setM(m);
                    q[std::make_pair(l, m)] +=
                        sphericalHarmonic.getValueAt(costheta, phi);
                  }
                }
                nBonds++;
              }
            }
          }
        }

        for (int l = 0; l <= lMax_; l++) {
          q2[l] = 0.0;
          for (int m = -l; m <= l; m++) {
            q[std::make_pair(l, m)] /= (RealType)nBonds;

            q2[l] += norm(q[std::make_pair(l, m)]);
          }
          q_l[l] = sqrt(q2[l] * 4.0 * Constants::PI / (RealType)(2 * l + 1));
        }

        // Find Third Order Invariant W_l

        for (int l = 0; l <= lMax_; l++) {
          w[l] = 0.0;
          for (int m1 = -l; m1 <= l; m1++) {
            std::pair<int, int> lm = std::make_pair(l, m1);
            for (int mmm = 0; mmm <= (m2Max[lm] - m2Min[lm]); mmm++) {
              int m2 = m2Min[lm] + mmm;
              int m3 = -m1 - m2;
              w[l] += w3j[lm][mmm] * q[lm] * q[std::make_pair(l, m2)] *
                      q[std::make_pair(l, m3)];
            }
          }

          w_hat[l] = w[l] / pow(q2[l], RealType(1.5));
        }

        collectHistogram(q_l, w_hat);

        Nbonds += nBonds;
        for (int l = 0; l <= lMax_; l++) {
          for (int m = -l; m <= l; m++) {
            QBar[std::make_pair(l, m)] +=
                (RealType)nBonds * q[std::make_pair(l, m)];
          }
        }
      }
    }

    // Normalize Qbar2
    for (int l = 0; l <= lMax_; l++) {
      for (int m = -l; m <= l; m++) {
        QBar[std::make_pair(l, m)] /= Nbonds;
      }
    }

    // Find second order invariant Q_l

    for (int l = 0; l <= lMax_; l++) {
      Q2[l] = 0.0;
      for (int m = -l; m <= l; m++) {
        Q2[l] += norm(QBar[std::make_pair(l, m)]);
      }
      Q[l] = sqrt(Q2[l] * 4.0 * Constants::PI / (RealType)(2 * l + 1));
    }

    // Find Third Order Invariant W_l

    for (int l = 0; l <= lMax_; l++) {
      W[l] = 0.0;
      for (int m1 = -l; m1 <= l; m1++) {
        std::pair<int, int> lm = std::make_pair(l, m1);
        for (int mmm = 0; mmm <= (m2Max[lm] - m2Min[lm]); mmm++) {
          int m2 = m2Min[lm] + mmm;
          int m3 = -m1 - m2;
          W[l] += w3j[lm][mmm] * QBar[lm] * QBar[std::make_pair(l, m2)] *
                  QBar[std::make_pair(l, m3)];
        }
      }

      W_hat[l] = W[l] / pow(Q2[l], RealType(1.5));
    }

    writeOrderParameter(Q, W_hat);
  }